

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathSumFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectPtr obj;
  xmlNodeSetPtr pxVar1;
  xmlXPathObjectPtr value;
  int error;
  long lVar2;
  double val;
  double dVar3;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 1) {
    if (ctxt->valueFrame < ctxt->valueNr) {
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) &&
         ((ctxt->value->type | XPATH_USERS) == XPATH_XSLT_TREE)) {
        obj = valuePop(ctxt);
        val = 0.0;
        if (((obj->nodesetval != (xmlNodeSetPtr)0x0) && (obj->nodesetval->nodeNr != 0)) &&
           (pxVar1 = obj->nodesetval, 0 < pxVar1->nodeNr)) {
          lVar2 = 0;
          do {
            dVar3 = xmlXPathCastNodeToNumber(pxVar1->nodeTab[lVar2]);
            val = val + dVar3;
            lVar2 = lVar2 + 1;
            pxVar1 = obj->nodesetval;
          } while (lVar2 < pxVar1->nodeNr);
        }
        value = xmlXPathCacheNewFloat(ctxt->context,val);
        valuePush(ctxt,value);
        xmlXPathReleaseObject(ctxt->context,obj);
        return;
      }
      error = 0xb;
    }
    else {
      error = 0x17;
    }
  }
  else {
    error = 0xc;
  }
  xmlXPathErr(ctxt,error);
  return;
}

Assistant:

void
xmlXPathSumFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur;
    int i;
    double res = 0.0;

    CHECK_ARITY(1);
    if ((ctxt->value == NULL) ||
	((ctxt->value->type != XPATH_NODESET) &&
	 (ctxt->value->type != XPATH_XSLT_TREE)))
	XP_ERROR(XPATH_INVALID_TYPE);
    cur = valuePop(ctxt);

    if ((cur->nodesetval != NULL) && (cur->nodesetval->nodeNr != 0)) {
	for (i = 0; i < cur->nodesetval->nodeNr; i++) {
	    res += xmlXPathCastNodeToNumber(cur->nodesetval->nodeTab[i]);
	}
    }
    valuePush(ctxt, xmlXPathCacheNewFloat(ctxt->context, res));
    xmlXPathReleaseObject(ctxt->context, cur);
}